

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3ExprFunction(Parse *pParse,ExprList *pList,Token *pToken)

{
  sqlite3 *db;
  Expr *p;
  
  db = pParse->db;
  p = sqlite3ExprAlloc(db,0x97,pToken,1);
  if (p == (Expr *)0x0) {
    sqlite3ExprListDelete(db,pList);
    p = (Expr *)0x0;
  }
  else {
    (p->x).pList = pList;
    sqlite3ExprSetHeight(pParse,p);
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprFunction(Parse *pParse, ExprList *pList, Token *pToken){
  Expr *pNew;
  sqlite3 *db = pParse->db;
  assert( pToken );
  pNew = sqlite3ExprAlloc(db, TK_FUNCTION, pToken, 1);
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList); /* Avoid memory leak when malloc fails */
    return 0;
  }
  pNew->x.pList = pList;
  assert( !ExprHasProperty(pNew, EP_xIsSelect) );
  sqlite3ExprSetHeight(pParse, pNew);
  return pNew;
}